

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-multiple.c
# Opt level: O2

int run_test_pipe_connect_multiple(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  client_t *pcVar5;
  bool bVar6;
  undefined8 uStack_30;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&server_handle,0);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_bind(&server_handle,"/tmp/uv-test-sock");
    if (iVar1 == 0) {
      iVar1 = uv_listen(&server_handle,0x80,connection_cb);
      if (iVar1 == 0) {
        lVar4 = 4;
        pcVar5 = clients;
        while (bVar6 = lVar4 != 0, lVar4 = lVar4 + -1, bVar6) {
          iVar1 = uv_pipe_init(uVar2,pcVar5,0);
          if (iVar1 != 0) {
            pcVar3 = "r == 0";
            uStack_30 = 0x5d;
            goto LAB_0013fdd0;
          }
          uv_pipe_connect(&pcVar5->conn_req,pcVar5,"/tmp/uv-test-sock",connect_cb);
          pcVar5 = pcVar5 + 1;
        }
        uv_run(uVar2,0);
        if (connection_cb_called == 4) {
          if (connect_cb_called == 4) {
            uVar2 = uv_default_loop();
            uv_walk(uVar2,close_walk_cb,0);
            uv_run(uVar2,0);
            uVar2 = uv_default_loop();
            iVar1 = uv_loop_close(uVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
            uStack_30 = 0x69;
          }
          else {
            pcVar3 = "connect_cb_called == NUM_CLIENTS";
            uStack_30 = 0x67;
          }
        }
        else {
          pcVar3 = "connection_cb_called == NUM_CLIENTS";
          uStack_30 = 0x66;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_30 = 0x59;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_30 = 0x56;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_30 = 0x53;
  }
LAB_0013fdd0:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-connect-multiple.c"
          ,uStack_30,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(pipe_connect_multiple) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  int i;
  int r;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &server_handle, 0);
  ASSERT(r == 0);

  r = uv_pipe_bind(&server_handle, TEST_PIPENAME);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)&server_handle, 128, connection_cb);
  ASSERT(r == 0);

  for (i = 0; i < NUM_CLIENTS; i++) {
    r = uv_pipe_init(loop, &clients[i].pipe_handle, 0);
    ASSERT(r == 0);
    uv_pipe_connect(&clients[i].conn_req,
                    &clients[i].pipe_handle,
                    TEST_PIPENAME,
                    connect_cb);
  }

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(connection_cb_called == NUM_CLIENTS);
  ASSERT(connect_cb_called == NUM_CLIENTS);

  MAKE_VALGRIND_HAPPY();
  return 0;
}